

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O2

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial
          (longdouble *__return_storage_ptr__,TPZGaussRule *this,longdouble x,int alpha,int beta,
          uint n)

{
  int iVar1;
  longdouble lVar2;
  int iVar3;
  longdouble *extraout_RAX;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  longdouble lVar11;
  TPZVec<long_double> p;
  TPZVec<long_double> local_48;
  
  iVar7 = (int)this;
  TPZVec<long_double>::TPZVec(&local_48,(ulong)(beta + 1));
  *local_48.fStore = (longdouble)1;
  if (beta != 0) {
    iVar1 = alpha + iVar7;
    local_48.fStore[1] =
         (((longdouble)iVar1 + (longdouble)2.0) * x + (longdouble)(iVar7 - alpha)) * (longdouble)0.5
    ;
    if (beta != 1) {
      iVar8 = alpha + 1;
      iVar4 = (iVar7 - alpha) * iVar1;
      iVar9 = (alpha + iVar7 + 3) * iVar4;
      lVar11 = (longdouble)1;
      for (lVar10 = 0; (ulong)(uint)beta * 2 + -2 != lVar10; lVar10 = lVar10 + 2) {
        iVar3 = (int)lVar10;
        iVar5 = iVar1 + iVar3 + 2;
        iVar6 = iVar1 + iVar3 + 4;
        lVar2 = *(longdouble *)((long)local_48.fStore + lVar10 * 8 + 0x10);
        *(longdouble *)((long)local_48.fStore + lVar10 * 8 + 0x20) =
             ((x * (longdouble)((iVar1 + iVar3 + 3) * iVar5 * iVar6) + (longdouble)iVar9) * lVar2 -
             lVar11 * (longdouble)((iVar7 * 2 + 2 + iVar3) * iVar8 * iVar6)) /
             (longdouble)((iVar8 + iVar7 + 1) * (iVar3 + 4) * iVar5);
        iVar8 = iVar8 + 1;
        iVar9 = iVar9 + iVar4 * 2;
        lVar11 = lVar2;
      }
    }
  }
  TPZVec<long_double>::~TPZVec(&local_48);
  return extraout_RAX;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x,int alpha,int beta,unsigned int n) {
	// the Jacobi polynomial is evaluated
	// using a recursion formula.
	TPZVec<long double> p(n+1);
	int v, a1, a2, a3, a4;
	
	// initial values P_0(x), P_1(x):
	p[0] = 1.0L;
	if(n==0) return p[0];
	p[1] = (((long double)(alpha+beta+2.0L))*x + ((long double)(alpha-beta)))/2.0L;
	if(n==1) return p[1];
	
	for(unsigned int i=1; i<=(n-1); ++i) {
		v  = 2*i + alpha + beta;
		a1 = 2*(i+1)*(i + alpha + beta + 1)*v;
		a2 = (v + 1)*(alpha*alpha - beta*beta);
		a3 = v*(v + 1)*(v + 2);
		a4 = 2*(i+alpha)*(i+beta)*(v + 2);
		
		p[i+1] = static_cast<long double>( (((long double)(a2)) + ((long double)(a3))*x)*p[i] - ((long double)(a4))*p[i-1])/((long double)(a1));
    } // for
	return p[n];
}